

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

void __thiscall adios2::Engine::Close(Engine *this,int transportIndex)

{
  Engine *pointer;
  long lVar1;
  string *psVar2;
  string name;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  pointer = this->m_Engine;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"in call to Engine::Close","")
  ;
  helper::CheckForNullptr<adios2::core::Engine>(pointer,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  adios2::core::Engine::Close((int)this->m_Engine);
  psVar2 = (string *)adios2::core::Engine::GetIO();
  lVar1 = *(long *)(this->m_Engine + 0x30);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,lVar1,*(long *)(this->m_Engine + 0x38) + lVar1);
  adios2::core::IO::RemoveEngine(psVar2);
  this->m_Engine = (Engine *)0x0;
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  return;
}

Assistant:

void Engine::Close(const int transportIndex)
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::Close");
    m_Engine->Close(transportIndex);

    // erase Engine object from IO
    core::IO &io = m_Engine->GetIO();
    const std::string name = m_Engine->m_Name;
    io.RemoveEngine(name);
    m_Engine = nullptr;
}